

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# io_dec.c
# Opt level: O0

int ExportAlphaRGBA4444(WebPDecParams *p,int y_pos,int max_lines_out)

{
  int iVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  uint uVar5;
  uint8_t *puVar6;
  int in_EDX;
  int in_ESI;
  long *in_RDI;
  uint32_t alpha_value;
  int i;
  uint32_t alpha_mask;
  int is_premult_alpha;
  int width;
  WEBP_CSP_MODE colorspace;
  int num_lines_out;
  uint8_t *alpha_dst;
  uint8_t *base_rgba;
  WebPRGBABuffer *buf;
  int in_stack_ffffffffffffffc0;
  uint uVar7;
  int local_2c;
  uint8_t *local_28;
  
  lVar2 = *in_RDI;
  puVar6 = (uint8_t *)(*(long *)(lVar2 + 0x10) + (long)in_ESI * (long)*(int *)(lVar2 + 0x18));
  local_28 = puVar6 + 1;
  local_2c = 0;
  iVar1 = *(int *)(in_RDI[9] + 0x34);
  iVar3 = WebPIsPremultipliedMode(*(WEBP_CSP_MODE *)*in_RDI);
  uVar7 = 0xf;
  for (; iVar4 = WebPRescalerHasPendingOutput
                           ((WebPRescaler *)CONCAT44(uVar7,in_stack_ffffffffffffffc0)),
      iVar4 != 0 && local_2c < in_EDX; local_2c = local_2c + 1) {
    WebPRescalerExportRow((WebPRescaler *)CONCAT44(uVar7,in_stack_ffffffffffffffc0));
    for (in_stack_ffffffffffffffc0 = 0; in_stack_ffffffffffffffc0 < iVar1;
        in_stack_ffffffffffffffc0 = in_stack_ffffffffffffffc0 + 1) {
      uVar5 = (int)(uint)*(byte *)(*(long *)(in_RDI[9] + 0x48) + (long)in_stack_ffffffffffffffc0) >>
              4;
      local_28[in_stack_ffffffffffffffc0 << 1] =
           local_28[in_stack_ffffffffffffffc0 << 1] & 0xf0 | (byte)uVar5;
      uVar7 = uVar5 & uVar7;
    }
    local_28 = local_28 + *(int *)(lVar2 + 0x18);
  }
  if ((iVar3 != 0) && (uVar7 != 0xf)) {
    (*WebPApplyAlphaMultiply4444)(puVar6,iVar1,local_2c,*(int *)(lVar2 + 0x18));
  }
  return local_2c;
}

Assistant:

static int ExportAlphaRGBA4444(WebPDecParams* const p, int y_pos,
                               int max_lines_out) {
  const WebPRGBABuffer* const buf = &p->output->u.RGBA;
  uint8_t* const base_rgba = buf->rgba + (size_t)y_pos * buf->stride;
#if (WEBP_SWAP_16BIT_CSP == 1)
  uint8_t* alpha_dst = base_rgba;
#else
  uint8_t* alpha_dst = base_rgba + 1;
#endif
  int num_lines_out = 0;
  const WEBP_CSP_MODE colorspace = p->output->colorspace;
  const int width = p->scaler_a->dst_width;
  const int is_premult_alpha = WebPIsPremultipliedMode(colorspace);
  uint32_t alpha_mask = 0x0f;

  while (WebPRescalerHasPendingOutput(p->scaler_a) &&
         num_lines_out < max_lines_out) {
    int i;
    assert(y_pos + num_lines_out < p->output->height);
    WebPRescalerExportRow(p->scaler_a);
    for (i = 0; i < width; ++i) {
      // Fill in the alpha value (converted to 4 bits).
      const uint32_t alpha_value = p->scaler_a->dst[i] >> 4;
      alpha_dst[2 * i] = (alpha_dst[2 * i] & 0xf0) | alpha_value;
      alpha_mask &= alpha_value;
    }
    alpha_dst += buf->stride;
    ++num_lines_out;
  }
  if (is_premult_alpha && alpha_mask != 0x0f) {
    WebPApplyAlphaMultiply4444(base_rgba, width, num_lines_out, buf->stride);
  }
  return num_lines_out;
}